

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

char * SoapySDRDevice_readSensor(SoapySDRDevice *device,char *key)

{
  char *__s;
  char *in_RSI;
  long *in_RDI;
  exception *ex;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  char *local_18;
  long *local_10;
  char *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,local_18,&local_59);
  (**(code **)(*local_10 + 0x298))(local_38,local_10,local_58);
  __s = (char *)std::__cxx11::string::c_str();
  local_8 = strdup(__s);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return local_8;
}

Assistant:

char *SoapySDRDevice_readSensor(const SoapySDRDevice *device, const char *key)
{
    __SOAPY_SDR_C_TRY
    return strdup(device->readSensor(key).c_str());
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}